

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O0

string * __thiscall
cmSourceFileLocation::GetFullPath_abi_cxx11_
          (string *__return_storage_ptr__,cmSourceFileLocation *this)

{
  string *psVar1;
  ulong uVar2;
  cmSourceFileLocation *this_local;
  string *path;
  
  psVar1 = GetDirectory_abi_cxx11_(this);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'/');
  }
  psVar1 = GetName_abi_cxx11_(this);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)psVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmSourceFileLocation::GetFullPath() const
{
  std::string path = this->GetDirectory();
  if (!path.empty()) {
    path += '/';
  }
  path += this->GetName();
  return path;
}